

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void insert<32000u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  TrieNode<unsigned_short> *pTVar2;
  ulong uVar3;
  ulong uVar4;
  vector_block<unsigned_char_*,_128U> *pvVar5;
  TrieNode<unsigned_short> *pTVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t depth;
  uchar *str;
  BurstSimple<unsigned_short> local_61;
  TrieNode<unsigned_short> *local_60;
  size_t local_58;
  uchar **local_50;
  vector_block<unsigned_char_*,_128U> *local_48;
  size_t local_40;
  uchar *local_38;
  
  if (n != 0) {
    sVar10 = 0;
    local_60 = root;
    local_58 = n;
    local_50 = strings;
    do {
      local_38 = local_50[sVar10];
      if (local_38 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_38 == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)CONCAT11(*local_38,local_38[1]);
      }
      uVar4 = uVar8 >> 6;
      bVar7 = (byte)uVar8;
      depth = 2;
      uVar3 = (local_60->is_trie).super__Base_bitset<1024UL>._M_w[uVar4] >> (uVar8 & 0x3f);
      pTVar2 = local_60;
      while ((uVar3 & 1) != 0) {
        if ((char)uVar8 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                       );
        }
        if (local_38[depth] == '\0') {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)CONCAT11(local_38[depth],local_38[depth + 1]);
        }
        pTVar2 = (TrieNode<unsigned_short> *)(pTVar2->buckets)._M_elems[uVar8];
        bVar7 = (byte)uVar9;
        uVar4 = uVar9 >> 6;
        depth = depth + 2;
        uVar8 = uVar9;
        uVar3 = (pTVar2->is_trie).super__Base_bitset<1024UL>._M_w[uVar4] >> (uVar9 & 0x3f);
      }
      pvVar5 = (vector_block<unsigned_char_*,_128U> *)(pTVar2->buckets)._M_elems[uVar8];
      local_40 = sVar10;
      if (pvVar5 == (vector_block<unsigned_char_*,_128U> *)0x0) {
        pvVar5 = (vector_block<unsigned_char_*,_128U> *)operator_new(0x28);
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar5->_insertpos = (uchar **)0x0;
        pvVar5->_left_in_block = 0;
        (pTVar2->buckets)._M_elems[uVar8] = pvVar5;
      }
      local_48 = pvVar5;
      vector_block<unsigned_char_*,_128U>::push_back(pvVar5,&local_38);
      pvVar5 = local_48;
      if (((char)uVar8 != '\0') &&
         (32000 < ((long)(local_48->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_48->_index_block).
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start) * 0x10 -
                  (ulong)local_48->_left_in_block)) {
        pTVar6 = BurstSimple<unsigned_short>::operator()(&local_61,local_48,depth);
        (pTVar2->buckets)._M_elems[uVar8] = pTVar6;
        p_Var1 = (pTVar2->is_trie).super__Base_bitset<1024UL>._M_w + uVar4;
        *p_Var1 = *p_Var1 | 1L << (bVar7 & 0x3f);
        vector_block<unsigned_char_*,_128U>::~vector_block(pvVar5);
        operator_delete(pvVar5);
      }
      sVar10 = local_40 + 1;
    } while (sVar10 != local_58);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}